

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void lest::inform(location *where,text *expr)

{
  undefined8 uVar1;
  char unaff_BPL;
  void *unaff_R12;
  void *unaff_R13;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  undefined1 local_1a8 [48];
  undefined1 *local_178;
  undefined1 local_168 [16];
  void *local_158;
  location *local_138;
  void *local_118;
  message local_a8;
  
  uVar1 = __cxa_rethrow();
  message::~message(&local_a8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_158 != unaff_R12) {
    operator_delete(local_158);
  }
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  if (local_138 != where) {
    operator_delete(local_138);
  }
  if (local_118 != unaff_R13) {
    operator_delete(local_118);
  }
  if (unaff_BPL != '\0') {
    __cxa_free_exception();
  }
  __cxa_end_catch();
  _Unwind_Resume(uVar1);
}

Assistant:

inline void inform( location where, text expr )
{
    try
    {
        throw;
    }
    catch( failure const & )
    {
        throw;
    }
    catch( std::exception const & e )
    {
        throw unexpected( where, expr, with_message( e.what() ) ); \
    }
    catch(...)
    {
        throw unexpected( where, expr, "of unknown type" ); \
    }
}